

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate2.cpp
# Opt level: O0

void __thiscall
qclab::qgates::QGate2<std::complex<float>_>::apply
          (QGate2<std::complex<float>_> *this,Side side,Op op,int nbQubits,
          SquareMatrix<std::complex<float>_> *matrix,int offset)

{
  long lVar1;
  int iVar2;
  value_type vVar3;
  int64_t iVar4;
  reference pvVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  complex<float> *pcVar9;
  byte bVar10;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  complex<float> local_310;
  complex<float> local_308;
  complex<float> local_300;
  complex<float> local_2f8;
  complex<float> local_2f0;
  complex<float> local_2e8;
  _ComplexT local_2e0;
  complex<float> local_2d8;
  complex<float> local_2d0;
  complex<float> local_2c8;
  complex<float> local_2c0;
  complex<float> local_2b8;
  complex<float> local_2b0;
  _ComplexT local_2a8;
  complex<float> local_2a0;
  complex<float> local_298;
  complex<float> local_290;
  complex<float> local_288;
  complex<float> local_280;
  complex<float> local_278;
  _ComplexT local_270;
  complex<float> local_268;
  complex<float> local_260;
  complex<float> local_258;
  complex<float> local_250;
  complex<float> local_248;
  complex<float> local_240;
  _ComplexT local_238;
  complex<float> local_230;
  complex<float> x4_1;
  complex<float> x3_1;
  complex<float> x2_1;
  complex<float> x1_1;
  int64_t i4;
  int64_t i3;
  int64_t i2;
  int64_t i1;
  int64_t i_1;
  int64_t k_1;
  int64_t j_1;
  int64_t nRight_1;
  int64_t nLeft_1;
  SquareMatrix<std::complex<float>_> local_1b8;
  complex<float> local_1a8;
  complex<float> local_1a0;
  complex<float> local_198;
  complex<float> local_190;
  complex<float> local_188;
  complex<float> local_180;
  _ComplexT local_178;
  complex<float> local_170;
  complex<float> local_168;
  complex<float> local_160;
  complex<float> local_158;
  complex<float> local_150;
  complex<float> local_148;
  _ComplexT local_140;
  complex<float> local_138;
  complex<float> local_130;
  complex<float> local_128;
  complex<float> local_120;
  complex<float> local_118;
  complex<float> local_110;
  _ComplexT local_108;
  complex<float> local_100;
  complex<float> local_f8;
  complex<float> local_f0;
  complex<float> local_e8;
  complex<float> local_e0;
  complex<float> local_d8;
  _ComplexT local_d0;
  complex<float> local_c8;
  complex<float> x4;
  complex<float> x3;
  complex<float> x2;
  complex<float> x1;
  int64_t j4;
  int64_t j3;
  int64_t j2;
  int64_t j1;
  int64_t j;
  int64_t k;
  int64_t i;
  int64_t nRight;
  int64_t nLeft;
  undefined1 local_50 [8];
  SquareMatrix<std::complex<float>_> mat2;
  vector<int,_std::allocator<int>_> qubits;
  int offset_local;
  SquareMatrix<std::complex<float>_> *matrix_local;
  int nbQubits_local;
  Op op_local;
  Side side_local;
  QGate2<std::complex<float>_> *this_local;
  
  if (nbQubits < 2) {
    __assert_fail("nbQubits >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                  ,0x23,
                  "virtual void qclab::qgates::QGate2<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
                 );
  }
  iVar4 = dense::SquareMatrix<std::complex<float>_>::size(matrix);
  bVar10 = (byte)nbQubits;
  if (iVar4 != 1 << (bVar10 & 0x1f)) {
    __assert_fail("matrix.size() == 1 << nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                  ,0x24,
                  "virtual void qclab::qgates::QGate2<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
                 );
  }
  (*(this->super_QObject<std::complex<float>_>)._vptr_QObject[5])(&mat2.data_);
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&mat2.data_,0);
  *pvVar5 = offset + *pvVar5;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&mat2.data_,1);
  *pvVar5 = offset + *pvVar5;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&mat2.data_,0);
  if (nbQubits <= *pvVar5) {
    __assert_fail("qubits[0] < nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                  ,0x28,
                  "virtual void qclab::qgates::QGate2<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
                 );
  }
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&mat2.data_,1);
  if (nbQubits <= *pvVar5) {
    __assert_fail("qubits[1] < nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                  ,0x28,
                  "virtual void qclab::qgates::QGate2<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
                 );
  }
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&mat2.data_,0);
  iVar2 = *pvVar5;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&mat2.data_,1);
  if (iVar2 + 1 != *pvVar5) {
    __assert_fail("qubits[0] + 1 == qubits[1]",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                  ,0x29,
                  "virtual void qclab::qgates::QGate2<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
                 );
  }
  (*(this->super_QObject<std::complex<float>_>)._vptr_QObject[7])(local_50);
  dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<float>>>
            (op,(SquareMatrix<std::complex<float>_> *)local_50);
  if (side == Left) {
    if (nbQubits == 2) {
      dense::SquareMatrix<std::complex<float>_>::operator*=
                (matrix,(SquareMatrix<std::complex<float>_> *)local_50);
    }
    else {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&mat2.data_,0);
      vVar3 = *pvVar5;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&mat2.data_,1);
      lVar6 = (long)(1 << ((bVar10 - (char)*pvVar5) - 1 & 0x1f));
      for (k = 0; iVar4 = dense::SquareMatrix<std::complex<float>_>::rows(matrix), k < iVar4;
          k = k + 1) {
        for (j = 0; j < 1 << ((byte)vVar3 & 0x1f); j = j + 1) {
          for (j1 = 0; j1 < lVar6; j1 = j1 + 1) {
            lVar1 = j1 + j * lVar6 * 4;
            lVar7 = lVar1 + lVar6;
            lVar8 = lVar7 + lVar6;
            pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()(matrix,k,lVar1);
            x2._M_value = pcVar9->_M_value;
            pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()(matrix,k,lVar7);
            x3._M_value = pcVar9->_M_value;
            pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()(matrix,k,lVar8);
            x4._M_value = pcVar9->_M_value;
            pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()(matrix,k,lVar8 + lVar6);
            local_c8._M_value = pcVar9->_M_value;
            pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                               ((SquareMatrix<std::complex<float>_> *)local_50,0,0);
            std::operator*(pcVar9,&x2);
            pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                               ((SquareMatrix<std::complex<float>_> *)local_50,1,0);
            std::operator*(pcVar9,&x3);
            std::operator+(&local_e8,&local_f0);
            pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                               ((SquareMatrix<std::complex<float>_> *)local_50,2,0);
            std::operator*(pcVar9,&x4);
            std::operator+(&local_e0,&local_f8);
            pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                               ((SquareMatrix<std::complex<float>_> *)local_50,3,0);
            std::operator*(pcVar9,&local_c8);
            std::operator+(&local_d8,&local_100);
            local_d0 = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
            pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()(matrix,k,lVar1);
            pcVar9->_M_value = local_d0;
            pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                               ((SquareMatrix<std::complex<float>_> *)local_50,0,1);
            std::operator*(pcVar9,&x2);
            pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                               ((SquareMatrix<std::complex<float>_> *)local_50,1,1);
            std::operator*(pcVar9,&x3);
            std::operator+(&local_120,&local_128);
            pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                               ((SquareMatrix<std::complex<float>_> *)local_50,2,1);
            std::operator*(pcVar9,&x4);
            std::operator+(&local_118,&local_130);
            pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                               ((SquareMatrix<std::complex<float>_> *)local_50,3,1);
            std::operator*(pcVar9,&local_c8);
            std::operator+(&local_110,&local_138);
            local_108 = CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
            pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()(matrix,k,lVar7);
            pcVar9->_M_value = local_108;
            pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                               ((SquareMatrix<std::complex<float>_> *)local_50,0,2);
            std::operator*(pcVar9,&x2);
            pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                               ((SquareMatrix<std::complex<float>_> *)local_50,1,2);
            std::operator*(pcVar9,&x3);
            std::operator+(&local_158,&local_160);
            pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                               ((SquareMatrix<std::complex<float>_> *)local_50,2,2);
            std::operator*(pcVar9,&x4);
            std::operator+(&local_150,&local_168);
            pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                               ((SquareMatrix<std::complex<float>_> *)local_50,3,2);
            std::operator*(pcVar9,&local_c8);
            std::operator+(&local_148,&local_170);
            local_140 = CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
            pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()(matrix,k,lVar8);
            pcVar9->_M_value = local_140;
            pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                               ((SquareMatrix<std::complex<float>_> *)local_50,0,3);
            std::operator*(pcVar9,&x2);
            pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                               ((SquareMatrix<std::complex<float>_> *)local_50,1,3);
            std::operator*(pcVar9,&x3);
            std::operator+(&local_190,&local_198);
            pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                               ((SquareMatrix<std::complex<float>_> *)local_50,2,3);
            std::operator*(pcVar9,&x4);
            std::operator+(&local_188,&local_1a0);
            pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                               ((SquareMatrix<std::complex<float>_> *)local_50,3,3);
            std::operator*(pcVar9,&local_c8);
            std::operator+(&local_180,&local_1a8);
            local_178 = CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
            pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()(matrix,k,lVar8 + lVar6);
            pcVar9->_M_value = local_178;
          }
        }
      }
    }
  }
  else if (nbQubits == 2) {
    dense::SquareMatrix<std::complex<float>_>::SquareMatrix
              ((SquareMatrix<std::complex<float>_> *)&nLeft_1,
               (SquareMatrix<std::complex<float>_> *)local_50);
    dense::operator*((dense *)&local_1b8,(SquareMatrix<std::complex<float>_> *)&nLeft_1,matrix);
    dense::SquareMatrix<std::complex<float>_>::operator=(matrix,&local_1b8);
    dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1b8);
    dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
              ((SquareMatrix<std::complex<float>_> *)&nLeft_1);
  }
  else {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&mat2.data_,0);
    vVar3 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&mat2.data_,1);
    lVar6 = (long)(1 << ((bVar10 - (char)*pvVar5) - 1 & 0x1f));
    for (k_1 = 0; iVar4 = dense::SquareMatrix<std::complex<float>_>::cols(matrix), k_1 < iVar4;
        k_1 = k_1 + 1) {
      for (i_1 = 0; i_1 < 1 << ((byte)vVar3 & 0x1f); i_1 = i_1 + 1) {
        for (i1 = 0; i1 < lVar6; i1 = i1 + 1) {
          lVar1 = i1 + i_1 * lVar6 * 4;
          lVar7 = lVar1 + lVar6;
          lVar8 = lVar7 + lVar6;
          pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()(matrix,lVar1,k_1);
          x2_1._M_value = pcVar9->_M_value;
          pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()(matrix,lVar7,k_1);
          x3_1._M_value = pcVar9->_M_value;
          pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()(matrix,lVar8,k_1);
          x4_1._M_value = pcVar9->_M_value;
          pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()(matrix,lVar8 + lVar6,k_1);
          local_230._M_value = pcVar9->_M_value;
          pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                             ((SquareMatrix<std::complex<float>_> *)local_50,0,0);
          std::operator*(pcVar9,&x2_1);
          pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                             ((SquareMatrix<std::complex<float>_> *)local_50,0,1);
          std::operator*(pcVar9,&x3_1);
          std::operator+(&local_250,&local_258);
          pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                             ((SquareMatrix<std::complex<float>_> *)local_50,0,2);
          std::operator*(pcVar9,&x4_1);
          std::operator+(&local_248,&local_260);
          pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                             ((SquareMatrix<std::complex<float>_> *)local_50,0,3);
          std::operator*(pcVar9,&local_230);
          std::operator+(&local_240,&local_268);
          local_238 = CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03);
          pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()(matrix,lVar1,k_1);
          pcVar9->_M_value = local_238;
          pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                             ((SquareMatrix<std::complex<float>_> *)local_50,1,0);
          std::operator*(pcVar9,&x2_1);
          pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                             ((SquareMatrix<std::complex<float>_> *)local_50,1,1);
          std::operator*(pcVar9,&x3_1);
          std::operator+(&local_288,&local_290);
          pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                             ((SquareMatrix<std::complex<float>_> *)local_50,1,2);
          std::operator*(pcVar9,&x4_1);
          std::operator+(&local_280,&local_298);
          pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                             ((SquareMatrix<std::complex<float>_> *)local_50,1,3);
          std::operator*(pcVar9,&local_230);
          std::operator+(&local_278,&local_2a0);
          local_270 = CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04);
          pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()(matrix,lVar7,k_1);
          pcVar9->_M_value = local_270;
          pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                             ((SquareMatrix<std::complex<float>_> *)local_50,2,0);
          std::operator*(pcVar9,&x2_1);
          pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                             ((SquareMatrix<std::complex<float>_> *)local_50,2,1);
          std::operator*(pcVar9,&x3_1);
          std::operator+(&local_2c0,&local_2c8);
          pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                             ((SquareMatrix<std::complex<float>_> *)local_50,2,2);
          std::operator*(pcVar9,&x4_1);
          std::operator+(&local_2b8,&local_2d0);
          pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                             ((SquareMatrix<std::complex<float>_> *)local_50,2,3);
          std::operator*(pcVar9,&local_230);
          std::operator+(&local_2b0,&local_2d8);
          local_2a8 = CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05);
          pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()(matrix,lVar8,k_1);
          pcVar9->_M_value = local_2a8;
          pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                             ((SquareMatrix<std::complex<float>_> *)local_50,3,0);
          std::operator*(pcVar9,&x2_1);
          pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                             ((SquareMatrix<std::complex<float>_> *)local_50,3,1);
          std::operator*(pcVar9,&x3_1);
          std::operator+(&local_2f8,&local_300);
          pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                             ((SquareMatrix<std::complex<float>_> *)local_50,3,2);
          std::operator*(pcVar9,&x4_1);
          std::operator+(&local_2f0,&local_308);
          pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                             ((SquareMatrix<std::complex<float>_> *)local_50,3,3);
          std::operator*(pcVar9,&local_230);
          std::operator+(&local_2e8,&local_310);
          local_2e0 = CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06);
          pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()(matrix,lVar8 + lVar6,k_1);
          pcVar9->_M_value = local_2e0;
        }
      }
    }
  }
  dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_50);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&mat2.data_);
  return;
}

Assistant:

void QGate2< T >::apply( Side side , Op op , const int nbQubits ,
                           qclab::dense::SquareMatrix< T >& matrix ,
                           const int offset ) const {
    assert( nbQubits >= 2 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    assert( qubits[0] < nbQubits ) ; assert( qubits[1] < nbQubits ) ;
    assert( qubits[0] + 1 == qubits[1] ) ;  // nearest neighbor qubtis
    // operation
    qclab::dense::SquareMatrix< T >  mat2 = this->matrix() ;
    qclab::dense::operateInPlace( op , mat2 ) ;
    // side
    if ( side == Side::Left ) {
      if ( nbQubits == 2 ) {
        matrix *= mat2 ;
      } else {
        // matrix *= kron( Ileft , mat2 , Iright )
        const int64_t nLeft  = 1 << qubits[0] ;
        const int64_t nRight = 1 << ( nbQubits - qubits[1] - 1 ) ;
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.rows(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t j = 0; j < nRight; j++ ) {
              const int64_t j1 = j + 4 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const int64_t j3 = j2 + nRight ;
              const int64_t j4 = j3 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              const T x3 = matrix(i,j3) ;
              const T x4 = matrix(i,j4) ;
              matrix(i,j1) = mat2(0,0) * x1 + mat2(1,0) * x2 +
                             mat2(2,0) * x3 + mat2(3,0) * x4 ;
              matrix(i,j2) = mat2(0,1) * x1 + mat2(1,1) * x2 +
                             mat2(2,1) * x3 + mat2(3,1) * x4 ;
              matrix(i,j3) = mat2(0,2) * x1 + mat2(1,2) * x2 +
                             mat2(2,2) * x3 + mat2(3,2) * x4 ;
              matrix(i,j4) = mat2(0,3) * x1 + mat2(1,3) * x2 +
                             mat2(2,3) * x3 + mat2(3,3) * x4 ;
            }
          }
        }
      }
    } else {
      if ( nbQubits == 2 ) {
        matrix = mat2 * matrix ;
      } else {
        // matrix = kron( Ileft , mat2 , Iright ) * matrix
        const int64_t nLeft  = 1 << qubits[0] ;
        const int64_t nRight = 1 << ( nbQubits - qubits[1] - 1 ) ;
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t i = 0; i < nRight; i++ ) {
              const int64_t i1 = i + 4 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const int64_t i3 = i2 + nRight ;
              const int64_t i4 = i3 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              const T x3 = matrix(i3,j) ;
              const T x4 = matrix(i4,j) ;
              matrix(i1,j) = mat2(0,0) * x1 + mat2(0,1) * x2 +
                             mat2(0,2) * x3 + mat2(0,3) * x4 ;
              matrix(i2,j) = mat2(1,0) * x1 + mat2(1,1) * x2 +
                             mat2(1,2) * x3 + mat2(1,3) * x4 ;
              matrix(i3,j) = mat2(2,0) * x1 + mat2(2,1) * x2 +
                             mat2(2,2) * x3 + mat2(2,3) * x4 ;
              matrix(i4,j) = mat2(3,0) * x1 + mat2(3,1) * x2 +
                             mat2(3,2) * x3 + mat2(3,3) * x4 ;
            }
          }
        }
      }
    }
  }